

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O2

UINT8 __thiscall S98Player::LoadTags(S98Player *this)

{
  UINT8 *startPtr;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  uint uVar1;
  pointer ppcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  UINT32 UVar6;
  int iVar7;
  UINT8 *pUVar8;
  mapped_type *this_01;
  _Base_ptr p_Var9;
  char **ppcVar10;
  size_type sVar11;
  UINT8 *startPtr_00;
  pointer local_80;
  string tagData;
  char *tagName;
  _Base_ptr local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->_tagData)._M_t);
  this_00 = &this->_tagList;
  ppcVar2 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar2) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  tagData._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)&tagData);
  uVar1 = (this->_fileHdr).tagOfs;
  if (uVar1 != 0) {
    UVar6 = DataLoader_GetSize(this->_dLoad);
    if (UVar6 <= uVar1) {
      return 0xf3;
    }
    startPtr_00 = this->_fileData + (this->_fileHdr).tagOfs;
    UVar6 = DataLoader_GetSize(this->_dLoad);
    pUVar8 = (UINT8 *)memchr(startPtr_00,0,(ulong)(UVar6 - (this->_fileHdr).tagOfs));
    if (pUVar8 == (UINT8 *)0x0) {
      pUVar8 = this->_fileData;
      UVar6 = DataLoader_GetSize(this->_dLoad);
      pUVar8 = pUVar8 + UVar6;
    }
    if ((this->_fileHdr).fileVer < 3) {
      GetUTF8String_abi_cxx11_(&tagData,this,(char *)startPtr_00,(char *)pUVar8);
      std::__cxx11::string::string((string *)&tagName,"TITLE",(allocator *)&local_80);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->_tagData,(key_type *)&tagName);
      std::__cxx11::string::operator=((string *)this_01,(string *)&tagData);
      std::__cxx11::string::~string((string *)&tagName);
    }
    else {
      tagData._M_dataplus._M_p = (pointer)&tagData.field_2;
      tagData._M_string_length = 0;
      tagData.field_2._M_local_buf[0] = '\0';
      if (((long)pUVar8 - (long)startPtr_00 < 5) ||
         (iVar7 = bcmp(startPtr_00,"[S98]",5), iVar7 != 0)) {
        emu_logf(&this->_logger,'\x01',"Invalid S98 tag data!\n");
        emu_logf(&this->_logger,'\x04',"tagData size: %zu, Signature: %.5s\n",
                 (long)pUVar8 - (long)startPtr_00,startPtr_00);
        std::__cxx11::string::~string((string *)&tagData);
        return 0xf0;
      }
      startPtr = startPtr_00 + 5;
      if (((long)pUVar8 - (long)startPtr < 3) ||
         (iVar7 = bcmp(startPtr,anon_var_dwarf_34335,3), iVar7 != 0)) {
        GetUTF8String_abi_cxx11_((string *)&tagName,this,(char *)startPtr,(char *)pUVar8);
        std::__cxx11::string::operator=((string *)&tagData,(string *)&tagName);
        std::__cxx11::string::~string((string *)&tagName);
      }
      else {
        emu_logf(&this->_logger,'\x04',"Note: Tags are UTF-8 encoded.\n");
        std::__cxx11::string::assign<char_const*,void>
                  ((string *)&tagData,(char *)(startPtr_00 + 8),(char *)pUVar8);
      }
      ParsePSFTags(this,&tagData);
    }
    std::__cxx11::string::~string((string *)&tagData);
    ppcVar2 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar2) {
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
    }
    for (p_Var9 = (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->_tagData)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      local_38 = p_Var9;
      std::__cxx11::string::string((string *)&tagData,(string *)(p_Var9 + 1));
      sVar4 = tagData._M_string_length;
      _Var3 = tagData._M_dataplus;
      for (sVar11 = 0; p_Var9 = local_38, sVar4 != sVar11; sVar11 = sVar11 + 1) {
        iVar7 = toupper((int)_Var3._M_p[sVar11]);
        _Var3._M_p[sVar11] = (char)iVar7;
      }
      tagName = (char *)0x0;
      for (ppcVar10 = S98_TAG_MAPPING + 1; ppcVar10[-1] != (char *)0x0; ppcVar10 = ppcVar10 + 2) {
        bVar5 = std::operator==(&tagData,ppcVar10[-1]);
        if (bVar5) {
          tagName = *ppcVar10;
          break;
        }
      }
      if (tagName == (char *)0x0) {
        local_80 = tagData._M_dataplus._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)this_00,&local_80);
      }
      else {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(this_00,&tagName);
      }
      local_80 = *(pointer *)(p_Var9 + 2);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)this_00,&local_80);
      std::__cxx11::string::~string((string *)&tagData);
    }
    tagData._M_dataplus._M_p = (pointer)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)&tagData);
  }
  return '\0';
}

Assistant:

UINT8 S98Player::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	_tagList.push_back(NULL);
	if (! _fileHdr.tagOfs)
		return 0x00;
	if (_fileHdr.tagOfs >= DataLoader_GetSize(_dLoad))
		return 0xF3;	// tag error (offset out-of-range)
	
	const char* startPtr;
	const char* endPtr;
	
	// find end of string (can be either '\0' or EOF)
	startPtr = (const char*)&_fileData[_fileHdr.tagOfs];
	endPtr = (const char*)memchr(startPtr, '\0', DataLoader_GetSize(_dLoad) - _fileHdr.tagOfs);
	if (endPtr == NULL)
		endPtr = (const char*)_fileData + DataLoader_GetSize(_dLoad);
	
	if (_fileHdr.fileVer < 3)
	{
		// tag offset = song title (\0-terminated)
		_tagData["TITLE"] = GetUTF8String(startPtr, endPtr);
	}
	else
	{
		std::string tagData;
		bool tagIsUTF8 = false;
		
		// tag offset = PSF tag
		if (endPtr - startPtr < 5 || memcmp(startPtr, "[S98]", 5))
		{
			emu_logf(&_logger, PLRLOG_ERROR, "Invalid S98 tag data!\n");
			emu_logf(&_logger, PLRLOG_DEBUG, "tagData size: %zu, Signature: %.5s\n", endPtr - startPtr, startPtr);
			return 0xF0;
		}
		startPtr += 5;
		if (endPtr - startPtr >= 3)
		{
			if (! memcmp(&startPtr[0], "\xEF\xBB\xBF", 3))	// check for UTF-8 BOM
			{
				tagIsUTF8 = true;
				startPtr += 3;
				emu_logf(&_logger, PLRLOG_DEBUG, "Note: Tags are UTF-8 encoded.\n");
			}
		}
		
		if (tagIsUTF8)
			tagData.assign(startPtr, endPtr);
		else
			tagData = GetUTF8String(startPtr, endPtr);
		ParsePSFTags(tagData);
	}
	
	_tagList.clear();
	
	std::map<std::string, std::string>::const_iterator mapIt;
	for (mapIt = _tagData.begin(); mapIt != _tagData.end(); ++ mapIt)
	{
		std::string curKey = mapIt->first;
		std::transform(curKey.begin(), curKey.end(), curKey.begin(), ::toupper);
		
		const char *tagName = NULL;
		for (const char* const* t = S98_TAG_MAPPING; *t != NULL; t += 2)
		{
			if (curKey == t[0])
			{
				tagName = t[1];
				break;
			}
		}
		
		if (tagName)
			_tagList.push_back(tagName);
		else
			_tagList.push_back(curKey.c_str());
		_tagList.push_back(mapIt->second.c_str());
	}
	
	_tagList.push_back(NULL);
	
	return 0x00;
}